

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

void __thiscall QDockWidgetGroupLayout::~QDockWidgetGroupLayout(QDockWidgetGroupLayout *this)

{
  Data *pDVar1;
  Data *pDVar2;
  
  *(undefined ***)&this->super_QLayout = &PTR_metaObject_007f5650;
  (this->super_QLayout).super_QLayoutItem._vptr_QLayoutItem =
       (_func_int **)&PTR__QDockWidgetGroupLayout_007f5758;
  QDockAreaLayoutInfo::deleteAllLayoutItems(&this->layoutState);
  QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(&(this->savedState).item_list.d);
  pDVar1 = (this->savedState).separatorWidgets.d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->savedState).separatorWidgets.d.d)->super_QArrayData,8,0x10);
    }
  }
  QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(&(this->layoutState).item_list.d);
  pDVar1 = (this->layoutState).separatorWidgets.d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->layoutState).separatorWidgets.d.d)->super_QArrayData,8,0x10);
    }
  }
  if ((this->super_QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>).separatorMoveTimer.m_id
      != Invalid) {
    QBasicTimer::stop();
  }
  pDVar2 = (this->super_QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>).movingSeparator.d.
           d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate
                (&((this->super_QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>).
                   movingSeparator.d.d)->super_QArrayData,4,0x10);
    }
  }
  QCursor::~QCursor(&(this->super_QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>).
                     adjustedCursor);
  QCursor::~QCursor(&(this->super_QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>).
                     oldCursor);
  pDVar2 = (this->super_QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>).hoverSeparator.d.d
  ;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
      QArrayData::deallocate
                (&((this->super_QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>).
                   hoverSeparator.d.d)->super_QArrayData,4,0x10);
    }
  }
  QLayout::~QLayout(&this->super_QLayout);
  return;
}

Assistant:

~QDockWidgetGroupLayout() {
        layoutState.deleteAllLayoutItems();
    }